

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalSlot.h
# Opt level: O0

void __thiscall
Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>>::operator()
          (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *this,
          shared_ptr<SocketClient> *args,unsigned_long *args_1)

{
  bool bVar1;
  reference ppVar2;
  pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>
  *connection;
  iterator __end0;
  iterator __begin0;
  map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
  *__range2;
  lock_guard<std::mutex> local_58;
  lock_guard<std::mutex> locker;
  map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
  conn;
  unsigned_long *args_local_1;
  shared_ptr<SocketClient> *args_local;
  Signal<std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_> *this_local;
  
  std::
  map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
  ::map((map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
         *)&locker);
  std::lock_guard<std::mutex>::lock_guard(&local_58,(mutex_type *)(this + 8));
  std::
  map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
  ::operator=((map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
               *)&locker,
              (map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
               *)(this + 0x30));
  std::lock_guard<std::mutex>::~lock_guard(&local_58);
  __end0 = std::
           map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
           ::begin((map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
                    *)&locker);
  connection = (pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>
                *)std::
                  map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
                  ::end((map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
                         *)&locker);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&connection);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>
             ::operator*(&__end0);
    std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>::operator()
              (&ppVar2->second,args,(int)*args_1);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>
    ::operator++(&__end0);
  }
  std::
  map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
  ::~map((map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_int)>_>_>_>
          *)&locker);
  return;
}

Assistant:

void operator()(const Args&... args)
    {
        std::map<Key, Signature> conn;
        {
            std::lock_guard<std::mutex> locker(mutex);
            conn = connections;
        }
        for (auto& connection : conn) {
            connection.second(std::forward<const Args &>(args)...);
        }
    }